

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.c
# Opt level: O0

double c_exp(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int n;
  double xx;
  double px;
  double x_local;
  
  if (x <= MAXLOG) {
    if (MINLOG <= x) {
      dVar1 = floor(LOG2E * x + 0.5);
      dVar2 = (x - dVar1 * C1) - dVar1 * C2;
      dVar3 = polevl(dVar2 * dVar2,P,2);
      dVar4 = polevl(dVar2 * dVar2,Q,3);
      dVar2 = ldexp((dVar2 * dVar3) / (dVar4 - dVar2 * dVar3),1);
      x_local = ldexp(dVar2 + 1.0,(int)dVar1);
    }
    else {
      mtherr(fname,4);
      x_local = 0.0;
    }
  }
  else {
    mtherr(fname,3);
    x_local = MAXNUM;
  }
  return x_local;
}

Assistant:

double c_exp(x)
double x;
{
double px, xx;
int n;
double polevl(), floor(), ldexp();

if( x > MAXLOG)
	{
	mtherr( fname, OVERFLOW );
	return( MAXNUM );
	}

if( x < MINLOG )
	{
	mtherr( fname, UNDERFLOW );
	return(0.0);
	}

/* Express e**x = e**g 2**n
 *   = e**g e**( n loge(2) )
 *   = e**( g + n loge(2) )
 */
px = floor( LOG2E * x + 0.5 ); /* floor() truncates toward -infinity. */
n = (int)px;
x -= px * C1;
x -= px * C2;

/* rational approximation for exponential
 * of the fractional part:
 * e**x = 1 + 2x P(x**2)/( Q(x**2) - P(x**2) )
 */
xx = x * x;
px = x * polevl( xx, P, 2 );
x =  px/( polevl( xx, Q, 3 ) - px );
x = 1.0 + ldexp( x, 1 );

/* multiply by power of 2 */
x = ldexp( x, n );
return(x);
}